

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O0

void bimodal_init(rand_gen *gen,param_3 *param)

{
  param_3 *param_local;
  rand_gen *gen_local;
  
  (gen->params).p1.a = param->a;
  (gen->params).p2.b = param->b;
  (gen->params).p3.c = param->c;
  gen->set_avg = bimodal_set_avg;
  gen->inv_cdf = bimodal_inv_cdf;
  gen->generate = (_func_double_rand_gen_ptr *)0x0;
  gen->gen_type = 0;
  free(param);
  return;
}

Assistant:

static void bimodal_init(struct rand_gen *gen, struct param_3 *param)
{
	gen->params.p3 = *param;
	gen->set_avg = bimodal_set_avg;
	gen->inv_cdf = bimodal_inv_cdf;
	gen->generate = NULL;
	gen->gen_type = GEN_OTHER;
	free(param);
}